

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O3

Llb_Man_t * Llb_ManStart(Aig_Man_t *pAigGlo,Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Llb_Man_t *p;
  Vec_Int_t *pVVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Llb_Mtr_t *pLVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  
  Aig_ManCleanMarkA(pAig);
  p = (Llb_Man_t *)calloc(1,0x88);
  p->pAigGlo = pAigGlo;
  p->pPars = pPars;
  p->pAig = pAig;
  pVVar4 = Llb_ManMarkPivotNodes(pAig,pPars->fUsePivots);
  p->vVar2Obj = pVVar4;
  pVVar5 = (Vec_Int_t *)calloc(1,0x10);
  uVar2 = pVVar4->nSize;
  uVar11 = (ulong)uVar2;
  if (uVar11 != 0) {
    piVar3 = pVVar4->pArray;
    iVar10 = *piVar3;
    if (1 < (int)uVar2) {
      uVar9 = 1;
      do {
        if (iVar10 <= piVar3[uVar9]) {
          iVar10 = piVar3[uVar9];
        }
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
    uVar1 = iVar10 + 1;
    if (iVar10 < 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((ulong)uVar1 << 2);
      pVVar5->pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar5->nCap = uVar1;
      memset(__s,0xff,(ulong)uVar1 << 2);
    }
    pVVar5->nSize = uVar1;
    if (0 < (int)uVar2) {
      uVar9 = 0;
      do {
        uVar2 = piVar3[uVar9];
        if ((ulong)uVar2 != 0xffffffff) {
          if (((int)uVar2 < 0) || (iVar10 < (int)uVar2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar2] = (int)uVar9;
        }
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
    }
  }
  p->vObj2Var = pVVar5;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  p->vRings = pVVar6;
  Llb_ManPrepareVarMap(p);
  Llb_ManPrepareGroups(p);
  Aig_ManCleanMarkA(pAig);
  pLVar8 = Llb_MtrCreate(p);
  p->pMatrix = pLVar8;
  pLVar8->pMan = p;
  return p;
}

Assistant:

Llb_Man_t * Llb_ManStart( Aig_Man_t * pAigGlo, Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Man_t * p;
    Aig_ManCleanMarkA( pAig );
    p = ABC_CALLOC( Llb_Man_t, 1 );
    p->pAigGlo  = pAigGlo;
    p->pPars    = pPars;
    p->pAig     = pAig;
    p->vVar2Obj = Llb_ManMarkPivotNodes( p->pAig, pPars->fUsePivots );
    p->vObj2Var = Vec_IntInvert( p->vVar2Obj, -1 );
    p->vRings   = Vec_PtrAlloc( 100 );
    Llb_ManPrepareVarMap( p );
    Llb_ManPrepareGroups( p );
    Aig_ManCleanMarkA( pAig );
    p->pMatrix = Llb_MtrCreate( p );
    p->pMatrix->pMan = p;
    return p;
}